

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O3

void __thiscall duckdb::ColumnData::MergeIntoStatistics(ColumnData *this,BaseStatistics *other)

{
  int iVar1;
  BaseStatistics *other_00;
  InternalException *this_00;
  string local_40;
  
  if ((this->stats).
      super_unique_ptr<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::SegmentStatistics_*,_std::default_delete<duckdb::SegmentStatistics>_>
      .super__Head_base<0UL,_duckdb::SegmentStatistics_*,_false>._M_head_impl ==
      (SegmentStatistics *)0x0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "ColumnData::MergeIntoStatistics called on a column without stats","");
    InternalException::InternalException(this_00,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->stats_lock);
  if (iVar1 == 0) {
    other_00 = &unique_ptr<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>,_true>
                ::operator->(&this->stats)->statistics;
    BaseStatistics::Merge(other,other_00);
    pthread_mutex_unlock((pthread_mutex_t *)&this->stats_lock);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void ColumnData::MergeStatistics(const BaseStatistics &other) {
	if (!stats) {
		throw InternalException("ColumnData::MergeStatistics called on a column without stats");
	}
	lock_guard<mutex> l(stats_lock);
	return stats->statistics.Merge(other);
}